

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void compile_assert_backtrackingpath(compiler_common *common,backtrack_common *current)

{
  PCRE2_UCHAR16 PVar1;
  PCRE2_UCHAR16 PVar2;
  sljit_compiler *compiler;
  PCRE2_SPTR16 pPVar3;
  backtrack_common *pbVar4;
  sljit_jump *psVar5;
  jump_list *pjVar6;
  jump_list **local_40;
  
  compiler = common->compiler;
  pPVar3 = current->cc;
  PVar1 = *pPVar3;
  if (PVar1 == 0x93) {
    if (compiler->error == 0) {
      compile_assert_backtrackingpath_cold_1();
    }
    if (-1 < *(int *)&current[1].nextbacktracks) {
      PVar2 = pPVar3[1];
      if ((PVar2 == 0x81) || (PVar2 == 0x7f)) {
        if (compiler->error == 0) {
          compile_assert_backtrackingpath_cold_2();
        }
        psVar5 = sljit_emit_cmp(compiler,1,2,0,0x40,0);
        if ((psVar5 != (sljit_jump *)0x0) &&
           (pbVar4 = current[1].top, pbVar4 != (backtrack_common *)0x0)) {
          psVar5->flags = (psVar5->flags & 0xfffffffffffffffcU) + 1;
          (psVar5->u).target = (sljit_uw)pbVar4;
        }
        sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,8);
        return;
      }
      compile_assert_backtrackingpath_cold_3();
      pPVar3 = pPVar3 + 1;
      goto LAB_0015562b;
    }
  }
  else if (-1 < *(int *)&current[1].nextbacktracks) {
LAB_0015562b:
    local_40 = &current[1].nextbacktracks;
    if ((*pPVar3 == 0x80) || (*pPVar3 == 0x7e)) {
      if (compiler->error == 0) {
        compile_assert_backtrackingpath_cold_4();
      }
      psVar5 = sljit_emit_jump(compiler,0x19);
      if (compiler->error == 0) {
        pjVar6 = (jump_list *)ensure_abuf(compiler,0x10);
        if (pjVar6 != (jump_list *)0x0) {
          pjVar6->next = common->revertframes;
          pjVar6->jump = psVar5;
          common->revertframes = pjVar6;
        }
        if (compiler->error == 0) {
          compile_assert_backtrackingpath_cold_5();
        }
      }
      sljit_emit_op2(compiler,0x60,0xc,0,0xc,0,0x40,(long)*(int *)local_40 * 8 + -8);
      if (compiler->error == 0) {
        compile_assert_backtrackingpath_cold_6();
      }
      pjVar6 = current->topbacktracks;
      sljit_emit_label(compiler);
      if (pjVar6 != (jump_list *)0x0) {
        compile_assert_backtrackingpath_cold_7();
      }
    }
    else {
      compile_assert_backtrackingpath_cold_8();
    }
    if (PVar1 != 0x93) {
      return;
    }
    compile_assert_backtrackingpath_cold_9();
    return;
  }
  compile_assert_backtrackingpath_cold_10();
  return;
}

Assistant:

static void compile_assert_backtrackingpath(compiler_common *common, struct backtrack_common *current)
{
DEFINE_COMPILER;
PCRE2_SPTR cc = current->cc;
PCRE2_UCHAR bra = OP_BRA;
struct sljit_jump *brajump = NULL;

SLJIT_ASSERT(*cc != OP_BRAMINZERO);
if (*cc == OP_BRAZERO)
  {
  bra = *cc;
  cc++;
  }

if (bra == OP_BRAZERO)
  {
  SLJIT_ASSERT(current->topbacktracks == NULL);
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_MEM1(STACK_TOP), STACK(0));
  }

if (CURRENT_AS(assert_backtrack)->framesize < 0)
  {
  set_jumps(current->topbacktracks, LABEL());

  if (bra == OP_BRAZERO)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    }
  return;
  }

if (bra == OP_BRAZERO)
  {
  if (*cc == OP_ASSERT_NOT || *cc == OP_ASSERTBACK_NOT)
    {
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    CMPTO(SLJIT_NOT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0, CURRENT_AS(assert_backtrack)->matchingpath);
    free_stack(common, 1);
    return;
    }
  free_stack(common, 1);
  brajump = CMP(SLJIT_EQUAL, STR_PTR, 0, SLJIT_IMM, 0);
  }

if (*cc == OP_ASSERT || *cc == OP_ASSERTBACK)
  {
  OP1(SLJIT_MOV, STACK_TOP, 0, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr);
  add_jump(compiler, &common->revertframes, JUMP(SLJIT_FAST_CALL));
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(-2));
  OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, (CURRENT_AS(assert_backtrack)->framesize - 1) * sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), CURRENT_AS(assert_backtrack)->private_data_ptr, TMP1, 0);

  set_jumps(current->topbacktracks, LABEL());
  }
else
  set_jumps(current->topbacktracks, LABEL());

if (bra == OP_BRAZERO)
  {
  /* We know there is enough place on the stack. */
  OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
  JUMPTO(SLJIT_JUMP, CURRENT_AS(assert_backtrack)->matchingpath);
  JUMPHERE(brajump);
  }
}